

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,char *filename,bool noPolicyScope)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  string filenametoread;
  cmListFile listFile;
  IncludeScope incScope;
  cmParseFileScope pfs;
  string local_a8;
  string local_88;
  IncludeScope local_68;
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"CMAKE_PARENT_LIST_FILE","");
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_CURRENT_LIST_FILE","");
  pcVar4 = GetDefinition(this,&local_a8);
  AddDefinition(this,(string *)local_58,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  std::__cxx11::string::string((string *)&local_88,filename,(allocator *)&local_68);
  cmState::Snapshot::GetDirectory((Directory *)local_58,&this->StateSnapshot);
  pcVar4 = cmState::Directory::GetCurrentSource((Directory *)local_58);
  cmsys::SystemTools::CollapseFullPath(&local_a8,&local_88,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  IncludeScope::IncludeScope(&local_68,this,&local_a8,noPolicyScope);
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  cmParseFileScope::cmParseFileScope((cmParseFileScope *)local_58,this);
  bVar2 = cmListFile::ParseFile((cmListFile *)&local_88,local_a8._M_dataplus._M_p,false,this);
  *(long *)(local_58._0_8_ + 0x660) = *(long *)(local_58._0_8_ + 0x660) + -8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._8_8_ != &local_40) {
    operator_delete((void *)local_58._8_8_,local_40._0_8_ + 1);
  }
  if (bVar2) {
    ReadListFile(this,(cmListFile *)&local_88,&local_a8);
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar3 = cmSystemTools::GetInterruptFlag();
      if (!bVar3) goto LAB_0032a783;
    }
    local_68.ReportError = false;
  }
LAB_0032a783:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_88);
  IncludeScope::~IncludeScope(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadDependentFile(const char* filename, bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }
  }

  this->ReadListFile(listFile, filenametoread);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    incScope.Quiet();
    }
  return true;
}